

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

bool __thiscall AST::equals(AST *this,AST *t)

{
  __type _Var1;
  int iVar2;
  int iVar3;
  bool bVar4;
  string sStack_58;
  string local_38;
  
  if (t == (AST *)0x0) {
    bVar4 = false;
  }
  else {
    getText_abi_cxx11_(&local_38,this);
    getText_abi_cxx11_(&sStack_58,t);
    _Var1 = std::operator==(&local_38,&sStack_58);
    if (_Var1) {
      iVar2 = (*this->node->_vptr_ASTNode[3])();
      iVar3 = (*t->node->_vptr_ASTNode[3])();
      bVar4 = iVar2 == iVar3;
    }
    else {
      bVar4 = false;
    }
    std::__cxx11::string::~string((string *)&sStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return bVar4;
}

Assistant:

bool AST::equals(const AST* t) const
{
	if (!t)
		return false;
	return (getText() == t->getText()) && (getType() == t->getType());
}